

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix.cc
# Opt level: O2

void __thiscall serial::MillisecondTimer::MillisecondTimer(MillisecondTimer *this,uint32_t millis)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  timespec tVar4;
  
  tVar4 = timespec_now();
  lVar3 = tVar4.tv_sec;
  uVar1 = (ulong)((double)millis * 1000000.0 + (double)tVar4.tv_nsec);
  if (999999999 < (long)uVar1) {
    uVar2 = uVar1 / 1000000000;
    uVar1 = uVar1 % 1000000000;
    lVar3 = lVar3 + uVar2;
  }
  (this->expiry).tv_sec = lVar3;
  (this->expiry).tv_nsec = uVar1;
  return;
}

Assistant:

MillisecondTimer::MillisecondTimer (const uint32_t millis)
  : expiry(timespec_now())
{
  int64_t tv_nsec = expiry.tv_nsec + (millis * 1e6);
  if (tv_nsec >= 1e9) {
    int64_t sec_diff = tv_nsec / static_cast<int> (1e9);
    expiry.tv_nsec = tv_nsec % static_cast<int>(1e9);
    expiry.tv_sec += sec_diff;
  } else {
    expiry.tv_nsec = tv_nsec;
  }
}